

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-util.cc
# Opt level: O2

bool tinyusdz::io::WriteWholeFile(string *filepath,uchar *contents,size_t content_bytes,string *err)

{
  bool bVar1;
  char *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  ofstream f;
  byte abStack_208 [480];
  
  ::std::ofstream::ofstream(&f,(filepath->_M_dataplus)._M_p,_S_bin);
  if ((abStack_208[*(long *)(_f + -0x18)] & 5) == 0) {
    ::std::ostream::write((char *)&f,(long)contents);
    if ((abStack_208[*(long *)(_f + -0x18)] & 5) == 0) {
      bVar1 = true;
      goto LAB_00239bb0;
    }
    if (err != (string *)0x0) {
      __lhs = "File write error: ";
      goto LAB_00239b6e;
    }
  }
  else if (err != (string *)0x0) {
    __lhs = "File open error for writing : ";
LAB_00239b6e:
    ::std::operator+(&bStack_268,__lhs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)filepath);
    ::std::operator+(&local_248,&bStack_268,"\n");
    ::std::__cxx11::string::append((string *)err);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
  }
  bVar1 = false;
LAB_00239bb0:
  ::std::ofstream::~ofstream(&f);
  return bVar1;
}

Assistant:

bool WriteWholeFile(const std::string &filepath, const unsigned char *contents,
                    size_t content_bytes, std::string *err) {
#ifdef _WIN32
#if defined(__GLIBCXX__)  // mingw
  int file_descriptor = _wopen(UTF8ToWchar(filepath).c_str(),
                               _O_CREAT | _O_WRONLY | _O_TRUNC | _O_BINARY);
  __gnu_cxx::stdio_filebuf<char> wfile_buf(
      file_descriptor, std::ios_base::out | std::ios_base::binary);
  std::ostream f(&wfile_buf);
#elif defined(_MSC_VER) || defined(_LIBCPP_VERSION)
  std::ofstream f(UTF8ToWchar(filepath).c_str(), std::ofstream::binary);
#else  // other C++ compiler for win32?
  std::ofstream f(filepath.c_str(), std::ofstream::binary);
#endif
#else
  std::ofstream f(filepath.c_str(), std::ofstream::binary);
#endif
  if (!f) {
    if (err) {
      (*err) += "File open error for writing : " + filepath + "\n";
    }
    return false;
  }

  f.write(reinterpret_cast<const char *>(contents),
          static_cast<std::streamsize>(content_bytes));
  if (!f) {
    if (err) {
      (*err) += "File write error: " + filepath + "\n";
    }
    return false;
  }

  return true;
}